

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::HeapType::getReferencedHeapTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapType *this)

{
  bool bVar1;
  HeapType *pHVar2;
  optional<wasm::HeapType> oVar3;
  _Storage<wasm::HeapType,_true> local_60;
  optional<wasm::HeapType> desc_1;
  optional<wasm::HeapType> desc;
  _Storage<wasm::HeapType,_true> local_30;
  optional<wasm::HeapType> super;
  HeapType *this_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types;
  
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._15_1_ = 0;
  getHeapTypeChildren(__return_storage_ptr__,this);
  oVar3 = getDeclaredSuperType(this);
  local_30 = oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_30._M_value);
  if (bVar1) {
    pHVar2 = std::optional<wasm::HeapType>::operator*
                       ((optional<wasm::HeapType> *)&local_30._M_value);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (__return_storage_ptr__,pHVar2);
  }
  oVar3 = getDescriptorType(this);
  desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ =
       oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_engaged);
  if (bVar1) {
    pHVar2 = std::optional<wasm::HeapType>::operator*
                       ((optional<wasm::HeapType> *)
                        &desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_engaged);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (__return_storage_ptr__,pHVar2);
  }
  oVar3 = getDescribedType(this);
  local_60 = oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_60._M_value);
  if (bVar1) {
    pHVar2 = std::optional<wasm::HeapType>::operator*
                       ((optional<wasm::HeapType> *)&local_60._M_value);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (__return_storage_ptr__,pHVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> HeapType::getReferencedHeapTypes() const {
  auto types = getHeapTypeChildren();
  if (auto super = getDeclaredSuperType()) {
    types.push_back(*super);
  }
  if (auto desc = getDescriptorType()) {
    types.push_back(*desc);
  }
  if (auto desc = getDescribedType()) {
    types.push_back(*desc);
  }
  return types;
}